

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::Unshift<Js::JavascriptArray::BigIndex,unsigned_long>
               (RecyclableObject *obj,BigIndex *toIndex,unsigned_long start,unsigned_long end,
               ScriptContext *scriptContext)

{
  BOOL BVar1;
  ThreadContext *threadContext;
  Var newValue;
  BigIndex BVar2;
  Var element;
  unsigned_long uStack_98;
  BOOL hasItem;
  unsigned_long i;
  BigIndex dst;
  BigIndex newEnd;
  ThrowTypeErrorOnFailureHelper h;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  unsigned_long end_local;
  unsigned_long start_local;
  BigIndex *toIndex_local;
  RecyclableObject *obj_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,obj);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)&newEnd.bigIndex,(ScriptContext *)jsReentLock._24_8_,
             L"Array.prototype.unshift");
  if (start < end) {
    BigIndex::BigIndex((BigIndex *)&dst.bigIndex,~start + end);
    BVar2 = BigIndex::operator+(toIndex,(BigIndex *)&dst.bigIndex);
    dst._0_8_ = BVar2.bigIndex;
    i._0_4_ = BVar2.index;
    for (uStack_98 = end; start < uStack_98; uStack_98 = uStack_98 - 1) {
      JsReentLock::unlock((JsReentLock *)local_50);
      BVar1 = Js::JavascriptOperators::HasItem(obj,uStack_98 - 1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      JsReentLock::relock((JsReentLock *)local_50);
      if (BVar1 == 0) {
        JsReentLock::unlock((JsReentLock *)local_50);
        BVar1 = IndexTrace<Js::JavascriptArray::BigIndex>::DeleteItem
                          (obj,(BigIndex *)&i,PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&newEnd.bigIndex,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        JsReentLock::relock((JsReentLock *)local_50);
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_50);
        newValue = Js::JavascriptOperators::GetItem
                             (obj,uStack_98 - 1,(ScriptContext *)jsReentLock._24_8_);
        BVar1 = IndexTrace<Js::JavascriptArray::BigIndex>::SetItem
                          (obj,(BigIndex *)&i,newValue,PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&newEnd.bigIndex,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        JsReentLock::relock((JsReentLock *)local_50);
      }
      BigIndex::operator--((BigIndex *)&i);
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return;
}

Assistant:

void JavascriptArray::Unshift(RecyclableObject* obj, const T& toIndex, P start, P end, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        typedef IndexTrace<T> index_trace;

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.unshift"));
        if (start < end)
        {
            T newEnd = (end - start - 1);// newEnd - 1
            T dst = toIndex + newEnd;
            for (P i = end; i > start; --i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i - 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, i - 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(index_trace::SetItem(obj, dst, element, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(index_trace::DeleteItem(obj, dst, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }

                --dst;
            }
        }
    }